

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exec.c
# Opt level: O0

int execle(char *__path,char *__arg,...)

{
  char **__envp;
  long lVar1;
  char **__argv;
  char in_AL;
  char *pcVar2;
  undefined8 in_RCX;
  undefined8 in_RDX;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  char *apcStack_180 [3];
  uint local_164;
  undefined8 *local_160;
  size_t *local_158;
  uint local_14c;
  char **local_148;
  long *local_140;
  size_t *local_138;
  uint local_12c;
  long local_128 [4];
  undefined8 local_108;
  undefined8 local_100;
  undefined8 local_f8;
  undefined8 local_e8;
  undefined8 local_d8;
  undefined8 local_c8;
  undefined8 local_b8;
  undefined8 local_a8;
  undefined8 local_98;
  undefined8 local_88;
  int local_70;
  int local_6c;
  int i;
  int res;
  char **envp;
  char *pcStack_58;
  int offset;
  unsigned_long __vla_expr0;
  char *local_48;
  char *arg_value;
  size_t argc;
  va_list argv_itr;
  char *args_local;
  char *path_local;
  
  __vla_expr0 = (unsigned_long)(apcStack_180 + 1);
  if (in_AL != '\0') {
    local_f8 = in_XMM0_Qa;
    local_e8 = in_XMM1_Qa;
    local_d8 = in_XMM2_Qa;
    local_c8 = in_XMM3_Qa;
    local_b8 = in_XMM4_Qa;
    local_a8 = in_XMM5_Qa;
    local_98 = in_XMM6_Qa;
    local_88 = in_XMM7_Qa;
  }
  arg_value = (char *)0x2;
  argv_itr[0]._0_8_ = &stack0x00000008;
  argc._0_4_ = 0x10;
  while( true ) {
    local_138 = &argc;
    local_12c = (uint)argc;
    if ((uint)argc < 0x29) {
      local_140 = (long *)((long)local_128 + (long)(int)(uint)argc);
      argc._0_4_ = (uint)argc + 8;
    }
    else {
      local_140 = (long *)argv_itr[0]._0_8_;
      argv_itr[0]._0_8_ = argv_itr[0]._0_8_ + 8;
    }
    local_48 = (char *)*local_140;
    if (local_48 == (char *)0x0) break;
    arg_value = arg_value + 1;
  }
  lVar1 = -((long)arg_value * 8 + 0xfU & 0xfffffffffffffff0);
  local_148 = (char **)((long)apcStack_180 + lVar1 + 8U);
  pcStack_58 = arg_value;
  argv_itr[0].overflow_arg_area = local_128;
  argv_itr[0]._0_8_ = &stack0x00000008;
  argc._4_4_ = 0x30;
  argc._0_4_ = 0x10;
  local_128[2] = in_RDX;
  local_128[3] = in_RCX;
  local_108 = in_R8;
  local_100 = in_R9;
  *(undefined8 *)((long)apcStack_180 + lVar1) = 0x103f1e;
  pcVar2 = strdup(__arg);
  *local_148 = pcVar2;
  envp._4_4_ = 1;
  while( true ) {
    __argv = local_148;
    local_14c = (uint)argc;
    if ((uint)argc < 0x29) {
      local_160 = (undefined8 *)((long)(int)(uint)argc + (long)argv_itr[0].overflow_arg_area);
      argc._0_4_ = (uint)argc + 8;
    }
    else {
      local_160 = (undefined8 *)argv_itr[0]._0_8_;
      argv_itr[0]._0_8_ = argv_itr[0]._0_8_ + 8;
    }
    pcVar2 = (char *)*local_160;
    local_158 = &argc;
    local_48 = pcVar2;
    if (pcVar2 == (char *)0x0) break;
    *(undefined8 *)((long)apcStack_180 + lVar1) = 0x103fa7;
    pcVar2 = strdup(pcVar2);
    local_148[envp._4_4_] = pcVar2;
    envp._4_4_ = envp._4_4_ + 1;
  }
  local_148[envp._4_4_] = (char *)0x0;
  apcStack_180[2] = (char *)&argc;
  local_164 = (uint)argc;
  if ((uint)argc < 0x29) {
    apcStack_180[1] = (char *)((long)(int)(uint)argc + (long)argv_itr[0].overflow_arg_area);
    argc._0_4_ = (uint)argc + 8;
  }
  else {
    apcStack_180[1] = (char *)argv_itr[0]._0_8_;
    argv_itr[0]._0_8_ = argv_itr[0]._0_8_ + 8;
  }
  __envp = *(char ***)apcStack_180[1];
  _i = __envp;
  *(undefined8 *)((long)apcStack_180 + lVar1) = 0x104058;
  local_6c = execve(__path,__argv,__envp);
  for (local_70 = 0; (char *)(long)local_70 < arg_value; local_70 = local_70 + 1) {
    pcVar2 = local_148[local_70];
    *(undefined8 *)((long)apcStack_180 + lVar1) = 0x104080;
    free(pcVar2);
  }
  return local_6c;
}

Assistant:

int execle(const char *path, const char *args, ...) {
    va_list argv_itr;

    size_t argc = 2; // reserve one for the path and one for NULL termination

    // count args received
    va_start(argv_itr, args);
    const char *arg_value = NULL;
    while ((arg_value = va_arg(argv_itr, const char *)) != NULL)
        argc++;
    va_end(argv_itr);

    // fill argv
    char *argv[argc];
    va_start(argv_itr, args);

    argv[0] = strdup(args);
    int offset = 1;
    while ((arg_value = va_arg(argv_itr, const char *)) != NULL) {
        argv[offset] = strdup(arg_value);
        offset++;
    }

    argv[offset] = NULL;
    char **envp = va_arg(argv_itr, char **);
    va_end(argv_itr);

    int res = execve(path, argv, envp);

    // free allocated strings
    for (int i = 0; i < argc; i++)
        free(argv[i]);

    return res;
}